

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_artifacts.cpp
# Opt level: O2

void __thiscall APowerInvulnerable::DoEffect(APowerInvulnerable *this)

{
  TObjPtr<AActor> *obj;
  byte *pbVar1;
  double dVar2;
  uint uVar3;
  AActor *pAVar4;
  
  APowerup::DoEffect(&this->super_APowerup);
  obj = &(this->super_APowerup).super_AInventory.Owner;
  pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
  if ((pAVar4 != (AActor *)0x0) && ((this->super_APowerup).Mode.super_FName.Index == 0x11)) {
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    uVar3 = (pAVar4->flags).Value;
    pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
    if ((uVar3 >> 0x12 & 1) == 0) {
      pAVar4->RenderStyle = LegacyRenderStyles[6];
      if (((byte)level.time & 7) == 0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if (0.0 < pAVar4->Alpha) {
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
          if (pAVar4->Alpha <= 1.0 && pAVar4->Alpha != 1.0) {
            pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
            dVar2 = pAVar4->Alpha;
            pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
            if ((dVar2 != 0.59375) || (NAN(dVar2))) {
              pAVar4->Alpha = 0.0;
              pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
              pbVar1 = (byte *)((long)&(pAVar4->flags2).Value + 3);
              *pbVar1 = *pbVar1 | 4;
            }
            else {
              pAVar4->Alpha = 0.40625;
            }
          }
        }
      }
      if (((byte)level.time & 0x1f) == 0) {
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        dVar2 = pAVar4->Alpha;
        pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
        if ((dVar2 != 0.0) || (NAN(dVar2))) {
          pAVar4->Alpha = 0.59375;
        }
        else {
          pbVar1 = (byte *)((long)&(pAVar4->flags2).Value + 3);
          *pbVar1 = *pbVar1 & 0xfb;
          pAVar4 = GC::ReadBarrier<AActor>((AActor **)obj);
          pAVar4->Alpha = 0.40625;
        }
      }
    }
    else {
      pbVar1 = (byte *)((long)&(pAVar4->flags2).Value + 3);
      *pbVar1 = *pbVar1 & 0xfb;
    }
  }
  return;
}

Assistant:

void APowerInvulnerable::DoEffect ()
{
	Super::DoEffect ();

	if (Owner == NULL)
	{
		return;
	}

	if (Mode == NAME_Ghost)
	{
		if (!(Owner->flags & MF_SHADOW))
		{
			// Don't mess with the translucency settings if an
			// invisibility powerup is active.
			Owner->RenderStyle = STYLE_Translucent;
			if (!(level.time & 7) && Owner->Alpha > 0 && Owner->Alpha < 1)
			{
				if (Owner->Alpha == HX_SHADOW)
				{
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = 0;
					Owner->flags2 |= MF2_NONSHOOTABLE;
				}
			}
			if (!(level.time & 31))
			{
				if (Owner->Alpha == 0)
				{
					Owner->flags2 &= ~MF2_NONSHOOTABLE;
					Owner->Alpha = HX_ALTSHADOW;
				}
				else
				{
					Owner->Alpha = HX_SHADOW;
				}
			}
		}
		else
		{
			Owner->flags2 &= ~MF2_NONSHOOTABLE;
		}
	}
}